

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_parse_l(archive_acl *acl,char *text,wchar_t default_type,archive_string_conv *sc
                           )

{
  int iVar1;
  wchar_t wVar2;
  bool bVar3;
  char *local_c0;
  char *end;
  char *start;
  wchar_t local_a8;
  wchar_t wStack_a4;
  char sep;
  wchar_t id;
  wchar_t permset;
  wchar_t tag;
  wchar_t type;
  wchar_t ret;
  wchar_t r;
  wchar_t n;
  wchar_t fields;
  anon_struct_16_2_267fbce2 name;
  anon_struct_16_2_267fbce2 field [4];
  archive_string_conv *sc_local;
  char *pcStack_20;
  wchar_t default_type_local;
  char *text_local;
  archive_acl *acl_local;
  
  tag = L'\0';
  pcStack_20 = text;
  text_local = (char *)acl;
  do {
    bVar3 = false;
    if (pcStack_20 != (char *)0x0) {
      bVar3 = *pcStack_20 != '\0';
    }
    if (!bVar3) {
      return tag;
    }
    r = L'\0';
    do {
      next_field(&stack0xffffffffffffffe0,&end,&local_c0,(char *)((long)&start + 7));
      if (r < L'\x04') {
        field[(long)r + -1].end = end;
        field[r].start = local_c0;
      }
      r = r + L'\x01';
      wVar2 = r;
    } while (start._7_1_ == ':');
    while (ret = wVar2, ret < L'\x04') {
      field[ret].start = (char *)0x0;
      field[(long)ret + -1].end = (char *)0x0;
      wVar2 = ret + L'\x01';
    }
    local_a8 = L'\xffffffff';
    isint(field[0].end,field[1].start,&local_a8);
    if ((local_a8 == L'\xffffffff') && (L'\x03' < r)) {
      isint(field[2].end,field[3].start,&local_a8);
    }
    wVar2 = default_type;
    if ((7 < (long)field[0].start - (long)name.end) &&
       (iVar1 = memcmp(name.end,"default",7), wVar2 = default_type, iVar1 == 0)) {
      permset = L'Ȁ';
      name.end = name.end + 7;
      wVar2 = permset;
    }
    permset = wVar2;
    name.start = (char *)0x0;
    _n = (char *)0x0;
    wVar2 = prefix_c(name.end,field[0].start,"user");
    if (wVar2 == L'\0') {
      wVar2 = prefix_c(name.end,field[0].start,"group");
      if (wVar2 == L'\0') {
        wVar2 = prefix_c(name.end,field[0].start,"other");
        if (wVar2 == L'\0') {
          wVar2 = prefix_c(name.end,field[0].start,"mask");
          if (wVar2 == L'\0') {
            return L'\xffffffec';
          }
          if ((((r != L'\x02') || (field[1].start <= field[0].end)) ||
              (wVar2 = ismode(field[0].end,field[1].start,&stack0xffffffffffffff5c), wVar2 == L'\0')
              ) && (((r != L'\x03' || (field[0].end != field[1].start)) ||
                    ((field[2].start <= field[1].end ||
                     (wVar2 = ismode(field[1].end,field[2].start,&stack0xffffffffffffff5c),
                     wVar2 == L'\0')))))) {
            return L'\xffffffec';
          }
          id = L'✕';
        }
        else {
          if ((((r != L'\x02') || (field[1].start <= field[0].end)) ||
              (wVar2 = ismode(field[0].end,field[1].start,&stack0xffffffffffffff5c), wVar2 == L'\0')
              ) && ((((r != L'\x03' || (field[0].end != field[1].start)) ||
                     (field[2].start <= field[1].end)) ||
                    (wVar2 = ismode(field[1].end,field[2].start,&stack0xffffffffffffff5c),
                    wVar2 == L'\0')))) {
            return L'\xffffffec';
          }
          id = L'✖';
        }
      }
      else {
        wVar2 = ismode(field[1].end,field[2].start,&stack0xffffffffffffff5c);
        if (wVar2 == L'\0') {
          return L'\xffffffec';
        }
        if ((local_a8 == L'\xffffffff') && (field[1].start <= field[0].end)) {
          id = L'✔';
        }
        else {
          id = L'✓';
          _n = field[0].end;
          name.start = field[1].start;
        }
      }
    }
    else {
      wVar2 = ismode(field[1].end,field[2].start,&stack0xffffffffffffff5c);
      if (wVar2 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_a8 == L'\xffffffff') && (field[1].start <= field[0].end)) {
        id = L'✒';
      }
      else {
        id = L'✑';
        _n = field[0].end;
        name.start = field[1].start;
      }
    }
    type = archive_acl_add_entry_len_l
                     ((archive_acl *)text_local,permset,wStack_a4,id,local_a8,_n,
                      (long)name.start - (long)_n,sc);
    if (type < L'\xffffffec') {
      return type;
    }
    if (type != L'\0') {
      tag = L'\xffffffec';
    }
  } while( true );
}

Assistant:

int
archive_acl_parse_l(struct archive_acl *acl,
    const char *text, int default_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[4], name;

	int fields, n, r, ret = ARCHIVE_OK;
	int type, tag, permset, id;
	char sep;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && memcmp(field[0].start, "default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_c(field[0].start, field[0].end, "user")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "group")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_c(field[0].start, field[0].end, "mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
	}
	return (ret);
}